

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O1

void kmpc_poolprint(void)

{
  uint uVar1;
  kmp_info_t *th;
  long lVar2;
  kmp_info_t **ppkVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  ppkVar3 = __kmp_threads;
  iVar4 = __kmp_get_global_thread_id();
  th = ppkVar3[iVar4];
  __kmp_bget_dequeue(th);
  uVar1 = *(uint *)(th->th_pad + 0x24);
  lVar2 = *(long *)(th->th_pad + 0x118);
  __kmp_printf_no_lock
            ("__kmp_printpool: T#%d total=%llu get=%lld rel=%lld pblk=%lld pget=%lld prel=%lld dget=%lld drel=%lld\n"
             ,(ulong)uVar1,*(undefined8 *)(lVar2 + 0x3c0),*(undefined8 *)(lVar2 + 0x3c8),
             *(undefined8 *)(lVar2 + 0x3d0),*(undefined8 *)(lVar2 + 0x3d8),
             *(undefined4 *)(lVar2 + 0x3e0),*(undefined4 *)(lVar2 + 1000),
             *(undefined4 *)(lVar2 + 0x3f0),*(undefined4 *)(lVar2 + 0x3f8));
  lVar5 = 0;
  iVar4 = 0;
  do {
    for (lVar6 = *(long *)(lVar2 + 0x20 + lVar5 * 0x30); lVar6 != lVar2 + lVar5 * 0x30;
        lVar6 = *(long *)(lVar6 + 0x20)) {
      iVar4 = iVar4 + 1;
      __kmp_printf_no_lock
                ("__kmp_printpool: T#%d Free block: 0x%p size %6ld bytes.\n",(ulong)uVar1,lVar6,
                 *(undefined8 *)(lVar6 + 0x10));
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x14);
  if (iVar4 != 0) {
    return;
  }
  __kmp_printf_no_lock("__kmp_printpool: T#%d No free blocks\n",(ulong)uVar1);
  return;
}

Assistant:

void kmpc_poolprint(void) {
  kmp_info_t *th = __kmp_get_thread();

  __kmp_bget_dequeue(th); /* Release any queued buffers */

  bfreed(th);
}